

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

SPIRBlock * __thiscall
diligent_spirv_cross::Compiler::maybe_get<diligent_spirv_cross::SPIRBlock>
          (Compiler *this,uint32_t id)

{
  Types TVar1;
  size_t sVar2;
  Variant *this_00;
  uint32_t id_local;
  Compiler *this_local;
  
  sVar2 = VectorView<diligent_spirv_cross::Variant>::size
                    (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>);
  if (id < sVar2) {
    this_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                        (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,(ulong)id);
    TVar1 = Variant::get_type(this_00);
    if (TVar1 == TypeBlock) {
      this_local = (Compiler *)get<diligent_spirv_cross::SPIRBlock>(this,id);
    }
    else {
      this_local = (Compiler *)0x0;
    }
  }
  else {
    this_local = (Compiler *)0x0;
  }
  return (SPIRBlock *)this_local;
}

Assistant:

const T *maybe_get(uint32_t id) const
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}